

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O1

bool __thiscall
Js::AsmJsModuleCompiler::SetupFunctionArguments
          (AsmJsModuleCompiler *this,AsmJsFunc *func,ParseNodePtr pnode)

{
  TypedRegisterAllocator *this_00;
  OpCode OVar1;
  ParseNode *pPVar2;
  ParseNode *pPVar3;
  bool bVar4;
  Types TVar5;
  RegSlot RVar6;
  RegSlot RVar7;
  ParseNode *arg;
  IdentPtr name;
  AsmJsVarBase *arg_00;
  ParseNodeBin *pPVar8;
  PropertyName pIVar9;
  RegisterSpace *pRVar10;
  ParseNodeUni *pPVar11;
  ParseNodeInt *pPVar12;
  ParseNodeCall *pPVar13;
  IdentPtr name_00;
  AsmJsFunctionDeclaration *sym;
  char16_t *pcVar14;
  ParseNodePtr node;
  ScriptContext *pSVar15;
  uint uVar16;
  ArgSlot local_5a;
  ulong uStack_58;
  ArgSlot numArguments;
  ParseNodePtr local_50;
  AsmJsModuleCompiler *local_48;
  AsmJsVarType local_3b;
  AsmJsVarType local_3a;
  AsmJsVarType local_39;
  AsmJsFunc *local_38;
  
  local_5a = 0;
  local_50 = pnode;
  arg = ParserWrapper::FunctionArgsList(&func->mFncNode->super_ParseNode,&local_5a);
  bVar4 = AsmJsFunctionDeclaration::EnsureArgCount(&func->super_AsmJsFunctionDeclaration,local_5a);
  if (bVar4) {
    this_00 = &func->mTypedRegisterAllocator;
    uStack_58 = 0;
    local_48 = this;
    local_38 = func;
    do {
      if (arg == (ParseNode *)0x0) {
        func->mBodyNode = local_50;
        return true;
      }
      if (local_50->nop != knopList) {
        pSVar15 = this->mCx->scriptContext;
        pcVar14 = L"Missing assignment statement for argument";
        goto LAB_009596b3;
      }
      bVar4 = ParserWrapper::IsDefinition(arg);
      if (!bVar4) {
        pSVar15 = this->mCx->scriptContext;
        pcVar14 = L"duplicate argument name not allowed";
        goto LAB_009596b3;
      }
      name = ParseNode::name(arg);
      bVar4 = AsmJSCompiler::CheckIdentifier(this,arg,name);
      if (bVar4) {
        arg_00 = AsmJsFunc::DefineVar(func,name,true,true);
        if (arg_00 == (AsmJsVarBase *)0x0) {
          pSVar15 = this->mCx->scriptContext;
          pcVar14 = L"Failed to define var";
        }
        else {
          pPVar8 = ParseNode::AsParseNodeBin(local_50);
          pPVar2 = pPVar8->pnode1;
          if (pPVar2->nop == knopAsg) {
            pPVar8 = ParseNode::AsParseNodeBin(pPVar2);
            pPVar3 = pPVar8->pnode1;
            pPVar8 = ParseNode::AsParseNodeBin(pPVar2);
            this = local_48;
            if (pPVar3->nop == knopName) {
              pPVar2 = pPVar8->pnode2;
              pIVar9 = ParserWrapper::VariableName(pPVar3);
              this = local_48;
              if (pIVar9->m_propertyId == ((arg_00->super_AsmJsSymbol).mName)->m_propertyId) {
                OVar1 = pPVar2->nop;
                if (OVar1 == knopCall) {
                  pPVar13 = ParseNode::AsParseNodeCall(pPVar2);
                  this = local_48;
                  if (pPVar13->pnodeTarget->nop == knopName) {
                    name_00 = ParseNode::name(pPVar13->pnodeTarget);
                    this = local_48;
                    sym = LookupIdentifier<Js::AsmJsFunctionDeclaration>(local_48,name_00);
                    if (sym == (AsmJsFunctionDeclaration *)0x0) {
                      pSVar15 = this->mCx->scriptContext;
                      pcVar14 = 
                      L"Cannot resolve function for argument definition, or wrong function";
                    }
                    else {
                      if ((sym->super_AsmJsSymbol).mType == MathBuiltinFunction) {
                        bVar4 = AsmJsMathFunction::IsFround(sym);
                        if (bVar4) {
                          AsmJsVarType::AsmJsVarType(&local_39,Float);
                          (arg_00->super_AsmJsSymbol).field_0x14 = local_39.which_;
                          RVar7 = AsmJsFunc::AcquireRegister<float>(local_38);
                          arg_00->mLocation = RVar7;
                          if (pPVar13->argCount != 0) {
                            node = pPVar13->pnodeArgs;
                            goto LAB_009593cb;
                          }
                          goto LAB_0095948e;
                        }
                        goto LAB_009595f4;
                      }
                      pSVar15 = this->mCx->scriptContext;
                      pcVar14 = L"Wrong function used for argument definition";
                    }
                  }
                  else {
LAB_009595f4:
                    pSVar15 = this->mCx->scriptContext;
                    pcVar14 = L"call should be for fround";
                  }
                  goto LAB_009594a2;
                }
                if (OVar1 == knopOr) {
                  AsmJsVarType::AsmJsVarType(&local_3a,Int);
                  (arg_00->super_AsmJsSymbol).field_0x14 = local_3a.which_;
                  TVar5 = WAsmJs::FromPrimitiveType<int>();
                  pRVar10 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar5);
                  RVar6 = WAsmJs::RegisterSpace::AcquireRegister(pRVar10);
                  arg_00->mLocation = RVar6;
                  pPVar8 = ParseNode::AsParseNodeBin(pPVar2);
                  pPVar3 = pPVar8->pnode1;
                  pPVar8 = ParseNode::AsParseNodeBin(pPVar2);
                  this = local_48;
                  if (pPVar3->nop == knopName) {
                    pPVar2 = pPVar8->pnode2;
                    pIVar9 = ParserWrapper::VariableName(pPVar3);
                    if (pIVar9->m_propertyId == ((arg_00->super_AsmJsSymbol).mName)->m_propertyId) {
                      if ((pPVar2->nop == knopInt) &&
                         (pPVar12 = ParseNode::AsParseNodeInt(pPVar2), pPVar12->lw == 0))
                      goto LAB_009593e9;
                      pSVar15 = this->mCx->scriptContext;
                      pcVar14 = L"Or value must be 0 when defining arguments";
                      goto LAB_009594a2;
                    }
                  }
                }
                else {
                  if (OVar1 != knopPos) {
                    pSVar15 = local_48->mCx->scriptContext;
                    pcVar14 = L"arguments are not casted as valid Asm.js type";
                    goto LAB_009594a2;
                  }
                  AsmJsVarType::AsmJsVarType(&local_3b,Double);
                  (arg_00->super_AsmJsSymbol).field_0x14 = local_3b.which_;
                  TVar5 = WAsmJs::FromPrimitiveType<double>();
                  pRVar10 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,TVar5);
                  RVar6 = WAsmJs::RegisterSpace::AcquireRegister(pRVar10);
                  arg_00->mLocation = RVar6;
                  pPVar11 = ParseNode::AsParseNodeUni(pPVar2);
                  node = pPVar11->pnode1;
LAB_009593cb:
                  if ((node->nop == knopName) &&
                     (pIVar9 = ParserWrapper::VariableName(node),
                     pIVar9->m_propertyId == ((arg_00->super_AsmJsSymbol).mName)->m_propertyId)) {
LAB_009593e9:
                    bVar4 = Phases::IsEnabled((Phases *)&DAT_015cd718,ByteCodePhase);
                    if (bVar4) {
                      Output::Print(L"    Argument [%s] Valid",&name->field_0x22);
                    }
                    uVar16 = (int)uStack_58 + 1;
                    bVar4 = AsmJsFunctionDeclaration::EnsureArgType
                                      (&local_38->super_AsmJsFunctionDeclaration,arg_00,
                                       (ArgSlot)uStack_58);
                    this = local_48;
                    if (bVar4) {
                      arg = ParserWrapper::NextVar(arg);
                      pPVar8 = ParseNode::AsParseNodeBin(local_50);
                      local_50 = pPVar8->pnode2;
                      bVar4 = true;
                      uStack_58 = (ulong)uVar16;
                      func = local_38;
                      this = local_48;
                    }
                    else {
                      bVar4 = false;
                      AsmJSCompiler::OutputError
                                (local_48->mCx->scriptContext,L"Unexpected argument type");
                      uStack_58 = (ulong)uVar16;
                      func = local_38;
                    }
                    goto LAB_009594ad;
                  }
                }
              }
            }
LAB_0095948e:
            pSVar15 = this->mCx->scriptContext;
            pcVar14 = L"Defining wrong argument";
          }
          else {
            pSVar15 = this->mCx->scriptContext;
            pcVar14 = L"Expecting an assignment";
          }
        }
LAB_009594a2:
        bVar4 = false;
        AsmJSCompiler::OutputError(pSVar15,pcVar14);
        func = local_38;
      }
      else {
        bVar4 = false;
      }
LAB_009594ad:
    } while (bVar4);
  }
  else {
    pSVar15 = this->mCx->scriptContext;
    pcVar14 = L"Cannot have variable number of arguments";
LAB_009596b3:
    AsmJSCompiler::OutputError(pSVar15,pcVar14);
  }
  return false;
}

Assistant:

bool AsmJsModuleCompiler::SetupFunctionArguments(AsmJsFunc * func, ParseNodePtr pnode)
    {
        // Check arguments
        ArgSlot numArguments = 0;
        ParseNode * fncNode = func->GetFncNode();
        ParseNode* argNode = ParserWrapper::FunctionArgsList(fncNode, numArguments);

        if (!func->EnsureArgCount(numArguments))
        {
            return Fail(argNode, _u("Cannot have variable number of arguments"));
        }

        ArgSlot index = 0;
        while (argNode)
        {
            if (pnode->nop != knopList)
            {
                return Fail(pnode, _u("Missing assignment statement for argument"));
            }


            if (!ParserWrapper::IsDefinition(argNode))
            {
                return Fail(argNode, _u("duplicate argument name not allowed"));
            }

            PropertyName argName = argNode->name();
            if (!AsmJSCompiler::CheckIdentifier(*this, argNode, argName))
            {
                return false;
            }

            // creates the variable
            AsmJsVarBase* var = func->DefineVar(argName, true);
            if (!var)
            {
                return Fail(argNode, _u("Failed to define var"));
            }

            ParseNode* argDefinition = ParserWrapper::GetBinaryLeft(pnode);
            if (argDefinition->nop != knopAsg)
            {
                return Fail(argDefinition, _u("Expecting an assignment"));
            }

            ParseNode* lhs = ParserWrapper::GetBinaryLeft(argDefinition);
            ParseNode* rhs = ParserWrapper::GetBinaryRight(argDefinition);

#define NodeDefineThisArgument(n,var) (n->nop == knopName && ParserWrapper::VariableName(n)->GetPropertyId() == var->GetName()->GetPropertyId())

            if (!NodeDefineThisArgument(lhs, var))
            {
                return Fail(lhs, _u("Defining wrong argument"));
            }

            if (rhs->nop == knopPos)
            {
                // unary + => double
                var->SetVarType(AsmJsVarType::Double);
                var->SetLocation(func->AcquireRegister<double>());
                // validate stmt
                ParseNode* argSym = ParserWrapper::GetUnaryNode(rhs);

                if (!NodeDefineThisArgument(argSym, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
            }
            else if (rhs->nop == knopOr)
            {
                var->SetVarType(AsmJsVarType::Int);
                var->SetLocation(func->AcquireRegister<int>());

                ParseNode* argSym = ParserWrapper::GetBinaryLeft(rhs);
                ParseNode* intSym = ParserWrapper::GetBinaryRight(rhs);
                // validate stmt
                if (!NodeDefineThisArgument(argSym, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
                if (intSym->nop != knopInt || intSym->AsParseNodeInt()->lw != 0)
                {
                    return Fail(lhs, _u("Or value must be 0 when defining arguments"));
                }
            }
            else if (rhs->nop == knopCall)
            {
                ParseNodeCall* callNode = rhs->AsParseNodeCall();
                if (callNode->pnodeTarget->nop != knopName)
                {
                    return Fail(rhs, _u("call should be for fround"));
                }
                AsmJsFunctionDeclaration* funcDecl = this->LookupFunction(callNode->pnodeTarget->name());

                if (!funcDecl)
                    return Fail(rhs, _u("Cannot resolve function for argument definition, or wrong function"));

                if (AsmJsMathFunction::Is(funcDecl))
                {
                    if (!AsmJsMathFunction::IsFround(funcDecl))
                    {
                        return Fail(rhs, _u("call should be for fround"));
                    }
                    var->SetVarType(AsmJsVarType::Float);
                    var->SetLocation(func->AcquireRegister<float>());
                }
                else
                {
                    return Fail(rhs, _u("Wrong function used for argument definition"));
                }

                if (callNode->argCount == 0 || !NodeDefineThisArgument(callNode->pnodeArgs, var))
                {
                    return Fail(lhs, _u("Defining wrong argument"));
                }
            }
            else
            {
                return Fail(rhs, _u("arguments are not casted as valid Asm.js type"));
            }

            if (PHASE_TRACE1(ByteCodePhase))
            {
                Output::Print(_u("    Argument [%s] Valid"), argName->Psz());
            }

            if (!func->EnsureArgType(var, index++))
            {
                return Fail(rhs, _u("Unexpected argument type"));
            }

            argNode = ParserWrapper::NextVar(argNode);
            pnode = ParserWrapper::GetBinaryRight(pnode);
        }

        func->SetBodyNode(pnode);
        return true;
    }